

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void delete_edge(edge_t_conflict e)

{
  bb_t pbVar1;
  out_edge_t peVar2;
  out_edge_t peVar3;
  in_edge_t_conflict peVar4;
  in_edge_t peVar5;
  bb_t_conflict bb;
  DLIST_LINK_out_edge_t *pDVar6;
  DLIST_LINK_in_edge_t *pDVar7;
  size_t *rpost;
  size_t *in_RSI;
  
  pbVar1 = e->src;
  peVar2 = (e->out_link).prev;
  if (peVar2 != (out_edge_t)0x0) {
    (peVar2->out_link).next = (e->out_link).next;
LAB_0015fec2:
    peVar3 = (e->out_link).next;
    if (peVar3 == (out_edge_t)0x0) {
      if ((pbVar1->out_edges).tail != e) goto LAB_0015ff44;
      pDVar6 = (DLIST_LINK_out_edge_t *)&(pbVar1->out_edges).tail;
    }
    else {
      pDVar6 = &peVar3->out_link;
    }
    pDVar6->prev = peVar2;
    (e->out_link).prev = (out_edge_t)0x0;
    (e->out_link).next = (out_edge_t)0x0;
    pbVar1 = e->dst;
    peVar4 = (e->in_link).prev;
    if (peVar4 == (in_edge_t_conflict)0x0) {
      if ((pbVar1->in_edges).head != e) goto LAB_0015ff49;
      (pbVar1->in_edges).head = (e->in_link).next;
    }
    else {
      (peVar4->in_link).next = (e->in_link).next;
    }
    peVar5 = (e->in_link).next;
    if (peVar5 == (in_edge_t)0x0) {
      if ((pbVar1->in_edges).tail != e) goto LAB_0015ff4e;
      pDVar7 = (DLIST_LINK_in_edge_t *)&(pbVar1->in_edges).tail;
    }
    else {
      pDVar7 = &peVar5->in_link;
    }
    pDVar7->prev = peVar4;
    (e->in_link).prev = (in_edge_t)0x0;
    (e->in_link).next = (in_edge_t)0x0;
    free(e);
    return;
  }
  if ((pbVar1->out_edges).head == e) {
    (pbVar1->out_edges).head = (e->out_link).next;
    goto LAB_0015fec2;
  }
  delete_edge_cold_1();
LAB_0015ff44:
  delete_edge_cold_2();
LAB_0015ff49:
  delete_edge_cold_3();
LAB_0015ff4e:
  delete_edge_cold_4();
  pbVar1 = (bb_t)*in_RSI;
  *in_RSI = (size_t)((long)&pbVar1->index + 1);
  e->dst = pbVar1;
  for (pbVar1 = e[1].dst; pbVar1 != (bb_t)0x0; pbVar1 = (pbVar1->bb_link).next) {
    bb = (bb_t_conflict)pbVar1->pre;
    if (bb->pre == 0) {
      DFS(bb,in_RSI,rpost);
    }
    else if (bb->rpost == 0) {
      *(undefined1 *)((long)&(pbVar1->in_edges).head + 1) = 1;
    }
  }
  peVar5 = (in_edge_t)*rpost;
  *rpost = (size_t)&peVar5[-1].field_0x37;
  (e->in_link).prev = peVar5;
  return;
}

Assistant:

static void delete_edge (edge_t e) {
  DLIST_REMOVE (out_edge_t, e->src->out_edges, e);
  DLIST_REMOVE (in_edge_t, e->dst->in_edges, e);
  free (e);
}